

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.hpp
# Opt level: O1

ostream * just::console::impl::operator<<(ostream *o_,color<void> c_)

{
  long lVar1;
  char *pcVar2;
  
  if (color<void>::black == c_._id) {
    pcVar2 = "black";
  }
  else {
    if (color<void>::red == c_._id) {
      pcVar2 = "red";
      lVar1 = 3;
      goto LAB_00102600;
    }
    if (color<void>::green != c_._id) {
      if (color<void>::yellow == c_._id) {
        pcVar2 = "yellow";
        lVar1 = 6;
        goto LAB_00102600;
      }
      if (color<void>::blue == c_._id) {
        pcVar2 = "blue";
      }
      else {
        if (color<void>::magenta == c_._id) {
          pcVar2 = "magenta";
          lVar1 = 7;
          goto LAB_00102600;
        }
        if (color<void>::cyan == c_._id) {
          pcVar2 = "cyan";
        }
        else {
          if (color<void>::gray != c_._id) {
            if (color<void>::bright_red == c_._id) {
              pcVar2 = "bright_red";
              lVar1 = 10;
              goto LAB_00102600;
            }
            if (color<void>::bright_green == c_._id) {
              pcVar2 = "bright_green";
              lVar1 = 0xc;
              goto LAB_00102600;
            }
            if (color<void>::bright_yellow == c_._id) {
              pcVar2 = "bright_yellow";
              lVar1 = 0xd;
              goto LAB_00102600;
            }
            if (color<void>::bright_blue == c_._id) {
              pcVar2 = "bright_blue";
            }
            else {
              if (color<void>::bright_magenta == c_._id) {
                pcVar2 = "bright_magenta";
                lVar1 = 0xe;
                goto LAB_00102600;
              }
              if (color<void>::bright_cyan != c_._id) {
                if (color<void>::white != c_._id) {
                  __assert_fail("!\"Invalid color value\"",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/include/just/console.hpp"
                                ,0x54,
                                "std::ostream &just::console::impl::operator<<(std::ostream &, color<T>) [T = void]"
                               );
                }
                pcVar2 = "white";
                goto LAB_001025e5;
              }
              pcVar2 = "bright_cyan";
            }
            lVar1 = 0xb;
            goto LAB_00102600;
          }
          pcVar2 = "gray";
        }
      }
      lVar1 = 4;
      goto LAB_00102600;
    }
    pcVar2 = "green";
  }
LAB_001025e5:
  lVar1 = 5;
LAB_00102600:
  std::__ostream_insert<char,std::char_traits<char>>(o_,pcVar2,lVar1);
  return o_;
}

Assistant:

std::ostream& operator<<(std::ostream& o_, color<T> c_)
      {
             if (c_ == color<T>::black)          { o_ << "black"; }
        else if (c_ == color<T>::red)            { o_ << "red"; }
        else if (c_ == color<T>::green)          { o_ << "green"; }
        else if (c_ == color<T>::yellow)         { o_ << "yellow"; }
        else if (c_ == color<T>::blue)           { o_ << "blue"; }
        else if (c_ == color<T>::magenta)        { o_ << "magenta"; }
        else if (c_ == color<T>::cyan)           { o_ << "cyan"; }
        else if (c_ == color<T>::gray)           { o_ << "gray"; }
        else if (c_ == color<T>::bright_red)     { o_ << "bright_red"; }
        else if (c_ == color<T>::bright_green)   { o_ << "bright_green"; }
        else if (c_ == color<T>::bright_yellow)  { o_ << "bright_yellow"; }
        else if (c_ == color<T>::bright_blue)    { o_ << "bright_blue"; }
        else if (c_ == color<T>::bright_magenta) { o_ << "bright_magenta"; }
        else if (c_ == color<T>::bright_cyan)    { o_ << "bright_cyan"; }
        else if (c_ == color<T>::white)          { o_ << "white"; }
        else { assert(!"Invalid color value"); }
  
        return o_;
      }